

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestsupport_gui.cpp
# Opt level: O1

void QtGuiTest::synthesizeWheelEvent(int rollCount,KeyboardModifiers modifiers)

{
  QDebug QVar1;
  bool bVar2;
  QPoint QVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QPointF local_80;
  undefined4 uStack_70;
  undefined4 local_6c;
  char *local_68;
  QDebug local_60;
  QDebug local_58;
  QDebug local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lcQtGuiTest();
  if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_80.xp._0_4_ = 2;
    local_80.xp._4_4_ = 0;
    local_80.yp._0_4_ = 0;
    local_80.yp._4_4_ = 0;
    uStack_70 = 0;
    local_6c = 0;
    local_68 = lcQtGuiTest::category.name;
    QMessageLogger::debug();
    QVar1.stream = local_60.stream;
    QVar4.m_data = (storage_type *)0x19;
    QVar4.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(&(QVar1.stream)->ts,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((local_60.stream)->space == true) {
      QTextStream::operator<<(&(local_60.stream)->ts,' ');
    }
    QTextStream::operator<<(&(local_60.stream)->ts,rollCount);
    if ((local_60.stream)->space == true) {
      QTextStream::operator<<(&(local_60.stream)->ts,' ');
    }
    local_58.stream = local_60.stream;
    (local_60.stream)->ref = (local_60.stream)->ref + 1;
    qt_QMetaEnum_flagDebugOperator
              ((QDebug *)&local_50,(ulonglong)&local_58,
               (QMetaObject *)
               (ulong)(uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i,
               (char *)&Qt::staticMetaObject);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug(&local_60);
  }
  QVar3 = QCursor::pos();
  local_48.d.d = (Data *)(double)QVar3.xp.m_i.m_i;
  local_48.d.ptr = (char16_t *)(double)QVar3.yp.m_i.m_i;
  local_80.xp = (qreal)local_48.d.d;
  local_80.yp = (qreal)local_48.d.ptr;
  bVar2 = QWindowSystemInterface::handleWheelEvent
                    ((QWindow *)0x0,&local_80,(QPointF *)&local_48,(QPoint)0x0,
                     (QPoint)((ulong)(uint)-rollCount << 0x20),modifiers,NoScrollPhase,
                     MouseEventNotSynthesized);
  if (bVar2) {
    QCoreApplication::sendPostedEvents((QObject *)0x0,0);
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_0031feea;
    local_80.xp._0_4_ = 2;
    local_80.xp._4_4_ = 0;
    local_80.yp._0_4_ = 0;
    local_80.yp._4_4_ = 0;
    uStack_70 = 0;
    local_6c = 0;
    local_68 = lcQtGuiTest::category.name;
    QMessageLogger::debug();
  }
  else {
    lcQtGuiTest();
    if (((byte)lcQtGuiTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) == 0)
    goto LAB_0031feea;
    local_80.xp._0_4_ = 2;
    local_80.xp._4_4_ = 0;
    local_80.yp._0_4_ = 0;
    local_80.yp._4_4_ = 0;
    uStack_70 = 0;
    local_6c = 0;
    local_68 = lcQtGuiTest::category.name;
    QMessageLogger::debug();
  }
  QVar1.stream = local_60.stream;
  QVar5.m_data = (storage_type *)0x9;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(&(QVar1.stream)->ts,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((local_60.stream)->space == true) {
    QTextStream::operator<<(&(local_60.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_60);
LAB_0031feea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QtGuiTest::synthesizeWheelEvent(int rollCount, Qt::KeyboardModifiers modifiers)
{
    deb << "Synthesizing wheel event:" << rollCount << modifiers;

    QPoint position = QCursor::pos();
    if (QWindowSystemInterface::handleWheelEvent(nullptr, position, position,
                                                 QPoint(), QPoint(0, -rollCount), modifiers)) {

        // It's unlikely that a shortcut relates to a subsequent wheel event.
        // But it's not harmful, to send posted events here.
        QCoreApplication::sendPostedEvents();
        deb << "(success)";
    } else {
        deb << "(failure)";
    }
}